

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,Token *args_1,MacroFormalArgumentListSyntax **args_2,
          span<slang::parsing::Token,_18446744073709551615UL> *args_3)

{
  MacroFormalArgumentListSyntax *pMVar1;
  pointer pTVar2;
  size_t sVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  DefineDirectiveSyntax *pDVar14;
  uint uStack_34;
  
  pDVar14 = (DefineDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefineDirectiveSyntax *)this->endPtr < pDVar14 + 1) {
    pDVar14 = (DefineDirectiveSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pDVar14 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar4 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar5 = args_1->info;
  pMVar1 = *args_2;
  pTVar2 = args_3->_M_ptr;
  sVar3 = (args_3->_M_extent)._M_extent_value;
  (pDVar14->super_DirectiveSyntax).super_SyntaxNode.kind = DefineDirective;
  (pDVar14->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar14->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar14->super_DirectiveSyntax).directive.kind = TVar6;
  (pDVar14->super_DirectiveSyntax).directive.field_0x2 = uVar7;
  (pDVar14->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar8.raw;
  (pDVar14->super_DirectiveSyntax).directive.rawLen = uVar9;
  (pDVar14->super_DirectiveSyntax).directive.info = pIVar4;
  (pDVar14->name).kind = TVar10;
  (pDVar14->name).field_0x2 = uVar11;
  (pDVar14->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (pDVar14->name).rawLen = uVar13;
  (pDVar14->name).info = pIVar5;
  pDVar14->formalArguments = pMVar1;
  (pDVar14->body).super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
  *(ulong *)&(pDVar14->body).super_SyntaxListBase.super_SyntaxNode.field_0x4 = (ulong)uStack_34;
  *(undefined8 *)((long)&(pDVar14->body).super_SyntaxListBase.super_SyntaxNode.parent + 4) = 0;
  *(undefined4 *)((long)&(pDVar14->body).super_SyntaxListBase.super_SyntaxNode.previewNode + 4) = 0;
  (pDVar14->body).super_SyntaxListBase.childCount = sVar3;
  (pDVar14->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = pTVar2;
  (pDVar14->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pDVar14->body).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00699340;
  if (pMVar1 != (MacroFormalArgumentListSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = (SyntaxNode *)pDVar14;
  }
  (pDVar14->body).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pDVar14;
  return pDVar14;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }